

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::attachment_reference2_is_supported
          (Impl *this,VkAttachmentReference2 *ref)

{
  bool bVar1;
  
  bVar1 = pnext_chain_is_supported(this,ref->pNext);
  if (bVar1) {
    bVar1 = image_layout_is_supported(this,ref->layout);
    if (bVar1) {
      bVar1 = aspect_mask_is_supported(this,ref->aspectMask);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::attachment_reference2_is_supported(const VkAttachmentReference2 &ref) const
{
	if (!pnext_chain_is_supported(ref.pNext))
		return false;
	if (!image_layout_is_supported(ref.layout))
		return false;
	if (!aspect_mask_is_supported(ref.aspectMask))
		return false;

	return true;
}